

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O0

void proto3_unittest::NestedTestAllTypes::SharedDtor(MessageLite *self)

{
  NestedTestAllTypes *this;
  TestAllTypes *this_00;
  Arena *pAVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_19;
  MessageLite *local_18;
  NestedTestAllTypes *this_;
  MessageLite *self_local;
  
  local_18 = self;
  this_ = (NestedTestAllTypes *)self;
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&self->_internal_metadata_);
  pAVar1 = google::protobuf::MessageLite::GetArena(local_18);
  if (pAVar1 == (Arena *)0x0) {
    this = (NestedTestAllTypes *)local_18[1]._internal_metadata_.ptr_;
    if (this != (NestedTestAllTypes *)0x0) {
      ~NestedTestAllTypes(this);
      operator_delete(this,0x28);
    }
    this_00 = (TestAllTypes *)local_18[2]._vptr_MessageLite;
    if (this_00 != (TestAllTypes *)0x0) {
      proto3_unittest::TestAllTypes::~TestAllTypes(this_00);
      operator_delete(this_00,0x2c8);
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3.pb.cc"
             ,0x11b7,"this_.GetArena() == nullptr");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline void NestedTestAllTypes::SharedDtor(MessageLite& self) {
  NestedTestAllTypes& this_ = static_cast<NestedTestAllTypes&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.child_;
  delete this_._impl_.payload_;
  this_._impl_.~Impl_();
}